

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintFieldName
          (FastFieldValuePrinter *this,Message *message,Reflection *reflection,
          FieldDescriptor *field,BaseTextGenerator *generator)

{
  bool bVar1;
  Type TVar2;
  Descriptor *this_00;
  FieldDescriptor *in_RCX;
  string *in_R8;
  char (*in_stack_ffffffffffffffb8) [2];
  FieldDescriptor *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  FieldDescriptor *in_stack_ffffffffffffffd0;
  
  bVar1 = FieldDescriptor::is_extension(in_RCX);
  if (bVar1) {
    BaseTextGenerator::PrintLiteral<2ul>
              ((BaseTextGenerator *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    FieldDescriptor::PrintableNameForExtension_abi_cxx11_((FieldDescriptor *)in_R8);
    BaseTextGenerator::PrintString((BaseTextGenerator *)in_R8,in_stack_ffffffffffffffc8);
    BaseTextGenerator::PrintLiteral<2ul>
              ((BaseTextGenerator *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    TVar2 = FieldDescriptor::type(in_stack_ffffffffffffffd0);
    if (TVar2 == TYPE_GROUP) {
      this_00 = FieldDescriptor::message_type(in_stack_ffffffffffffffc0);
      Descriptor::name_abi_cxx11_(this_00);
      BaseTextGenerator::PrintString((BaseTextGenerator *)in_stack_ffffffffffffffd0,in_R8);
    }
    else {
      FieldDescriptor::name_abi_cxx11_(in_RCX);
      BaseTextGenerator::PrintString
                ((BaseTextGenerator *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
  }
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintFieldName(
    const Message& message, const Reflection* reflection,
    const FieldDescriptor* field, BaseTextGenerator* generator) const {
  if (field->is_extension()) {
    generator->PrintLiteral("[");
    generator->PrintString(field->PrintableNameForExtension());
    generator->PrintLiteral("]");
  } else if (field->type() == FieldDescriptor::TYPE_GROUP) {
    // Groups must be serialized with their original capitalization.
    generator->PrintString(field->message_type()->name());
  } else {
    generator->PrintString(field->name());
  }
}